

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvmapImage.cpp
# Opt level: O0

void __thiscall EnvmapImage::clear(EnvmapImage *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Rgba *pRVar5;
  long in_RDI;
  Rgba *p;
  int x;
  int y;
  int h;
  int w;
  float f;
  int local_18;
  int local_14;
  
  iVar1 = *(int *)(in_RDI + 0xc);
  iVar2 = *(int *)(in_RDI + 4);
  iVar3 = *(int *)(in_RDI + 0x10);
  iVar4 = *(int *)(in_RDI + 8);
  for (local_14 = 0; local_14 < (iVar3 - iVar4) + 1; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < (iVar1 - iVar2) + 1; local_18 = local_18 + 1) {
      pRVar5 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[]
                         ((Array2D<Imf_3_4::Rgba> *)(in_RDI + 0x18),(long)local_14);
      pRVar5 = pRVar5 + local_18;
      f = (float)((ulong)in_RDI >> 0x20);
      Imath_3_2::half::operator=(&pRVar5->r,f);
      Imath_3_2::half::operator=(&pRVar5->r,f);
      Imath_3_2::half::operator=(&pRVar5->r,f);
      Imath_3_2::half::operator=(&pRVar5->r,f);
    }
  }
  return;
}

Assistant:

void
EnvmapImage::clear ()
{
    int w = _dataWindow.max.x - _dataWindow.min.x + 1;
    int h = _dataWindow.max.y - _dataWindow.min.y + 1;

    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            Rgba& p = _pixels[y][x];

            p.r = 0;
            p.g = 0;
            p.b = 0;
            p.a = 0;
        }
    }
}